

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::apply
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,
          function<Eigen::Array<double,__1,_1,_0,__1,_1>_(const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
          *f)

{
  MatrixXd *pMVar1;
  void *local_78 [2];
  void *local_68;
  long local_60;
  vectype local_58;
  double *local_48;
  MatrixXd *local_38;
  void **local_30;
  
  pMVar1 = LMatrixLibrary::get((LMatrixLibrary *)l_matrix_library,
                               (this->m_c).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows - 1);
  get_node_function_values((ChebyshevExpansion *)&local_48);
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)local_78,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48);
  if (*(long *)(f + 0x10) == 0) {
    std::__throw_bad_function_call();
  }
  else {
    (**(code **)(f + 0x18))(&local_68,f,local_78);
    if ((pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
        == local_60) {
      local_38 = pMVar1;
      local_30 = &local_68;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::Array<double,_1,1,0,_1,1>>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_58,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_>,_0>_>
                  *)&local_38);
      ChebyshevExpansion(__return_storage_ptr__,&local_58,this->m_xmin,this->m_xmax);
      free(local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      free(local_68);
      free(local_78[0]);
      free(local_48);
      return __return_storage_ptr__;
    }
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Product.h"
                ,0x62,
                "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::MatrixWrapper<Eigen::Array<double, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::MatrixWrapper<Eigen::Array<double, -1, 1>>, Option = 0]"
               );
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::apply(std::function<Eigen::ArrayXd(const Eigen::ArrayXd &)> &f) const{
        // 1. Transform Chebyshev-Lobatto node function values by the function f(y) -> y2
        // 2. Go backwards to coefficients from node values c2 = V*y2
        const auto Ndegree = m_c.size()-1;
        const Eigen::MatrixXd &V = l_matrix_library.get(Ndegree);
        return ChebyshevExpansion(V*f(get_node_function_values()).matrix(), xmin(), xmax());
    }